

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_dictAttachPref_e ZVar1;
  int iVar2;
  ZSTD_strategy ZVar3;
  U32 UVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  void *pvVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  undefined4 uVar14;
  U32 UVar15;
  U32 end;
  uint uVar16;
  ZSTD_TraceCtx ZVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  byte bVar21;
  ZSTD_compressedBlockState_t *bs;
  uint uVar22;
  uint uVar23;
  ZSTD_matchState_t *srcMatchState;
  size_t sVar24;
  ZSTD_matchState_t *dstMatchState;
  U32 *workspace;
  ZSTD_CCtx_params local_e0;
  
  sVar19 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar19 = cdict->dictContentSize;
  }
  ZVar17 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar17;
  if (cdict == (ZSTD_CDict *)0x0) {
    sVar18 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar19,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar18) {
      return sVar18;
    }
  }
  else {
    if (((cdict->dictContentSize != 0) &&
        ((((pledgedSrcSize < 0x20000 || (pledgedSrcSize == 0xffffffffffffffff)) ||
          (pledgedSrcSize < cdict->dictContentSize * 6)) || (cdict->compressionLevel == 0)))) &&
       (ZVar1 = params->attachDictPref, ZVar1 != ZSTD_dictForceLoad)) {
      iVar2 = (cdict->matchState).dedicatedDictSearch;
      ZVar3 = (cdict->matchState).cParams.strategy;
      if (iVar2 == 0) {
        if ((pledgedSrcSize == 0xffffffffffffffff) ||
           (pledgedSrcSize <= attachDictSizeCutoffs[ZVar3])) {
          if (ZVar1 != ZSTD_dictForceCopy) goto LAB_001b577b;
        }
        else if (ZVar1 == ZSTD_dictForceAttach) {
LAB_001b577b:
          if (params->forceWindow == 0) goto LAB_001b559a;
        }
        memcpy(&local_e0,params,0xb0);
        uVar8 = (cdict->matchState).cParams.chainLog;
        uVar9 = (cdict->matchState).cParams.hashLog;
        uVar10 = (cdict->matchState).cParams.searchLog;
        uVar11 = (cdict->matchState).cParams.minMatch;
        local_e0.cParams.targetLength = (cdict->matchState).cParams.targetLength;
        local_e0.cParams.strategy = (cdict->matchState).cParams.strategy;
        local_e0.cParams.chainLog = uVar8;
        local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
        local_e0.cParams.hashLog = uVar9;
        local_e0.cParams.searchLog = uVar10;
        local_e0.cParams.minMatch = uVar11;
        sVar19 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
        if (0xffffffffffffff88 < sVar19) {
          return sVar19;
        }
        (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
        ZVar3 = (cdict->matchState).cParams.strategy;
        if ((ZVar3 == ZSTD_fast) ||
           ((ZVar3 - ZSTD_greedy < 3 && (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder))
           )) {
          sVar24 = 0;
        }
        else {
          sVar24 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
        }
        bVar21 = (byte)(cdict->matchState).cParams.hashLog;
        memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
               4L << (bVar21 & 0x3f));
        ZVar3 = (cctx->appliedParams).cParams.strategy;
        if ((ZVar3 != ZSTD_fast) &&
           ((2 < ZVar3 - ZSTD_greedy ||
            ((cctx->appliedParams).useRowMatchFinder != ZSTD_urm_enableRowMatchFinder)))) {
          memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar24);
        }
        if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
           (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder)) {
          memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,
                 2L << (bVar21 & 0x3f));
        }
        UVar4 = (cctx->blockState).matchState.hashLog3;
        sVar24 = 0;
        if (UVar4 != 0) {
          sVar24 = 4L << ((byte)UVar4 & 0x3f);
        }
        memset((cctx->blockState).matchState.hashTable3,0,sVar24);
        pvVar6 = (cctx->workspace).tableEnd;
        if ((cctx->workspace).tableValidEnd < pvVar6) {
          (cctx->workspace).tableValidEnd = pvVar6;
        }
        uVar14 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
        (cctx->blockState).matchState.window.nbOverflowCorrections =
             (cdict->matchState).window.nbOverflowCorrections;
        *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar14;
        pBVar12 = (cdict->matchState).window.nextSrc;
        pBVar13 = (cdict->matchState).window.base;
        UVar4 = (cdict->matchState).window.dictLimit;
        UVar15 = (cdict->matchState).window.lowLimit;
        (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
        (cctx->blockState).matchState.window.dictLimit = UVar4;
        (cctx->blockState).matchState.window.lowLimit = UVar15;
        (cctx->blockState).matchState.window.nextSrc = pBVar12;
        (cctx->blockState).matchState.window.base = pBVar13;
        UVar4 = (cdict->matchState).nextToUpdate;
        (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
        (cctx->blockState).matchState.nextToUpdate = UVar4;
        goto LAB_001b59cf;
      }
LAB_001b559a:
      memcpy(&local_e0,params,0xb0);
      uVar16 = (cdict->matchState).cParams.windowLog;
      local_e0.cParams.chainLog = (cdict->matchState).cParams.chainLog;
      uVar23 = (cdict->matchState).cParams.hashLog;
      local_e0.cParams.hashLog = uVar23 - 2;
      if (local_e0.cParams.hashLog < 7) {
        local_e0.cParams.hashLog = 6;
      }
      if (2 < ZVar3 - ZSTD_greedy) {
        local_e0.cParams.hashLog = uVar23;
      }
      if (iVar2 == 0) {
        local_e0.cParams.hashLog = uVar23;
      }
      if (pledgedSrcSize < 0x40000000) {
        uVar22 = (int)pledgedSrcSize - 1;
        uVar23 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar23 = (uVar23 ^ 0xffffffe0) + 0x21;
        if (pledgedSrcSize < 0x40) {
          uVar23 = 6;
        }
        if (uVar16 < uVar23) {
          uVar23 = uVar16;
        }
LAB_001b5749:
        uVar16 = uVar23 + 1;
        if (local_e0.cParams.hashLog < uVar23 + 1) {
          uVar16 = local_e0.cParams.hashLog;
        }
        local_e0.cParams.hashLog = uVar16;
        if (uVar23 < (local_e0.cParams.chainLog - 1) + (uint)(ZVar3 < ZSTD_btlazy2)) {
          local_e0.cParams.chainLog = (uVar23 + 1) - (uint)(ZVar3 < ZSTD_btlazy2);
        }
      }
      else {
        uVar23 = uVar16;
        if (pledgedSrcSize != 0xffffffffffffffff) goto LAB_001b5749;
      }
      uVar5 = (cdict->matchState).cParams.searchLog;
      uVar7 = (cdict->matchState).cParams.minMatch;
      local_e0.cParams.strategy = ZVar3;
      local_e0.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
      local_e0.cParams.searchLog = uVar5;
      local_e0.cParams.minMatch = uVar7;
      sVar19 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar19) {
        return sVar19;
      }
      uVar20 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar16 = (uint)uVar20;
      if ((cdict->matchState).window.dictLimit != uVar16) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        uVar23 = (cctx->blockState).matchState.window.dictLimit;
        if (uVar23 < uVar16) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar20 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar16;
          (cctx->blockState).matchState.window.dictLimit = uVar16;
          uVar23 = uVar16;
        }
        (cctx->blockState).matchState.loadedDictEnd = uVar23;
      }
LAB_001b59cf:
      cctx->dictID = cdict->dictID;
      cctx->dictContentSize = cdict->dictContentSize;
      memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
      return 0;
    }
    sVar18 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar19,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar18) {
      return sVar18;
    }
    if (cdict != (ZSTD_CDict *)0x0) {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      bs = (cctx->blockState).prevCBlock;
      workspace = cctx->entropyWorkspace;
      dictSize = cdict->dictContentSize;
      goto LAB_001b56fd;
    }
  }
  bs = (cctx->blockState).prevCBlock;
  workspace = cctx->entropyWorkspace;
LAB_001b56fd:
  sVar18 = ZSTD_compress_insertDictionary
                     (bs,&(cctx->blockState).matchState,&cctx->ldmState,&cctx->workspace,
                      &cctx->appliedParams,dict,dictSize,dictContentType,dtlm,workspace);
  if (sVar18 < 0xffffffffffffff89) {
    cctx->dictID = (U32)sVar18;
    cctx->dictContentSize = sVar19;
    return 0;
  }
  return sVar18;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}